

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidPooling3dCostumPaddingSetForNonCustomPaddingType(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetwork *pNVar5;
  NeuralNetworkLayer *this_00;
  Pooling3DLayerParams *pPVar6;
  ostream *poVar7;
  Model m1;
  Result res;
  
  CoreML::Specification::Model::Model(&m1);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(this,10);
  CoreML::Specification::ArrayFeatureType::add_shape(this,0xb);
  CoreML::Specification::ArrayFeatureType::add_shape(this,0xc);
  CoreML::Specification::ArrayFeatureType::add_shape(this,0xd);
  CoreML::Specification::ArrayFeatureType::add_shape(this,0xe);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"probs");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pNVar5 = CoreML::Specification::Model::mutable_neuralnetwork(&m1);
  pNVar5->arrayinputshapemapping_ = 1;
  this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (&pNVar5->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  pPVar6 = CoreML::Specification::NeuralNetworkLayer::mutable_pooling3d(this_00);
  pPVar6->kerneldepth_ = 2;
  pPVar6->kernelheight_ = 2;
  pPVar6->kernelwidth_ = 2;
  pPVar6->stridedepth_ = 5;
  pPVar6->paddingtype_ = 1;
  pPVar6->strideheight_ = 5;
  pPVar6->stridewidth_ = 5;
  pPVar6->custompaddingfront_ = 7;
  pPVar6->custompaddingback_ = 7;
  pPVar6->custompaddingtop_ = 7;
  pPVar6->custompaddingbottom_ = 7;
  pPVar6->custompaddingleft_ = 7;
  pPVar6->custompaddingright_ = 7;
  CoreML::validate<(MLModelType)500>(&res,&m1);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x508);
    poVar7 = std::operator<<(poVar7,": error: ");
    poVar7 = std::operator<<(poVar7,"!((res).good())");
    poVar7 = std::operator<<(poVar7," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return (uint)bVar1;
}

Assistant:

int testInvalidPooling3dCostumPaddingSetForNonCustomPaddingType() {
    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    // Adding 5 shapes for a rank 5 input.
    shape->add_shape(10);
    shape->add_shape(11);
    shape->add_shape(12);
    shape->add_shape(13);
    shape->add_shape(14);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(CoreML::Specification::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *pooling3dLayer = nn->add_layers();
    pooling3dLayer->add_input("input");
    pooling3dLayer->add_output("probs");
    auto *mutablePooling3d = pooling3dLayer->mutable_pooling3d();
    
    // Add Kernel sizes
    mutablePooling3d->set_kerneldepth(2);
    mutablePooling3d->set_kernelheight(2);
    mutablePooling3d->set_kernelwidth(2);

    // Add Strides
    mutablePooling3d->set_stridedepth(5);
    mutablePooling3d->set_strideheight(5);
    mutablePooling3d->set_stridewidth(5);

    // Add 6 Custom Paddings
    mutablePooling3d->set_paddingtype(CoreML::Specification::Pooling3DLayerParams_Pooling3DPaddingType_VALID);
    mutablePooling3d->set_custompaddingfront(7);
    mutablePooling3d->set_custompaddingback(7);
    mutablePooling3d->set_custompaddingtop(7);
    mutablePooling3d->set_custompaddingbottom(7);
    mutablePooling3d->set_custompaddingleft(7);
    mutablePooling3d->set_custompaddingright(7);
    
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    
    return 0;
}